

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

int evfilt_write_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  uint *in_R8;
  epoll_event *ev;
  socklen_t slen;
  int serr;
  int ret;
  knote *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  undefined8 *local_28;
  undefined8 *local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_10 = in_RDI;
  epoll_event_dump((epoll_event *)CONCAT44(4,in_stack_ffffffffffffffc0));
  *local_10 = *local_28;
  local_10[1] = local_28[1];
  local_10[2] = local_28[2];
  local_10[3] = local_28[3];
  if ((*(uint *)(local_28 + 4) & 1) == 0) {
    if ((*in_R8 & 0x10) != 0) {
      *(ushort *)((long)local_10 + 10) = *(ushort *)((long)local_10 + 10) | 0x8000;
    }
    if ((*in_R8 & 8) != 0) {
      if ((*(uint *)(local_28 + 4) & 0x3e0) == 0) {
        *(undefined4 *)((long)local_10 + 0xc) = 5;
        local_38 = in_stack_ffffffffffffffb4;
      }
      else {
        local_34 = getsockopt((int)*local_28,1,4,&local_38,(socklen_t *)&stack0xffffffffffffffc4);
        if (local_34 < 0) {
          piVar2 = __errno_location();
          local_38 = *piVar2;
        }
        *(int *)((long)local_10 + 0xc) = local_38;
      }
      *(ushort *)((long)local_10 + 10) = *(ushort *)((long)local_10 + 10) | 0x8000;
      in_stack_ffffffffffffffb4 = local_38;
    }
    if (((*(ushort *)((long)local_10 + 10) & 0x8000) == 0) &&
       (iVar1 = ioctl((int)*local_10,0x5411,local_10 + 2), iVar1 < 0)) {
      local_10[2] = 0;
    }
  }
  iVar1 = knote_copyout_flag_actions
                    ((filter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
evfilt_write_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr)
{
    int ret;
    int serr;
    socklen_t slen = sizeof(serr);
    struct epoll_event * const ev = (struct epoll_event *) ptr;

    epoll_event_dump(ev);
    memcpy(dst, &src->kev, sizeof(*dst));

    /*
     * Fast path for files...
     */
    if (src->kn_flags & KNFL_FILE) goto done;

    if (ev->events & EPOLLHUP)
        dst->flags |= EV_EOF;

    if (ev->events & EPOLLERR) {
        if (src->kn_flags & KNFL_SOCKET) {
            ret = getsockopt(src->kev.ident, SOL_SOCKET, SO_ERROR, &serr, &slen);
            dst->fflags = ((ret < 0) ? errno : serr);
        } else
            dst->fflags = EIO;

        /*
         * The only way we seem to be able to signal an error
         * is by setting EOF on the socket.
         */
        dst->flags |= EV_EOF;
    }

    /* On return, data contains the the amount of space remaining in the write buffer */
    if (!(dst->flags & EV_EOF) && (ioctl(dst->ident, SIOCOUTQ, &dst->data) < 0)) {
            /* race condition with socket close, so ignore this error */
            dbg_puts("ioctl(2) of socket failed");
            dst->data = 0;
    }

done:
    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}